

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O2

int pop_mem(em8051 *aCPU)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U];
  iVar2 = pop_from_stack(aCPU);
  if ((char)bVar1 < '\0') {
    aCPU->mSFR[(ulong)bVar1 - 0x80] = (uchar)iVar2;
    if (aCPU->sfrwrite != (em8051sfrwrite)0x0) {
      (*aCPU->sfrwrite)(aCPU,(uint)bVar1);
    }
  }
  else {
    aCPU->mLowerData[bVar1] = (uchar)iVar2;
  }
  aCPU->mPC = aCPU->mPC + 2;
  return 1;
}

Assistant:

static int pop_mem(struct em8051 *aCPU)
{
    int address = OPERAND1;
    if (address > 0x7f)
    {
        aCPU->mSFR[address - 0x80] = pop_from_stack(aCPU);
        if (aCPU->sfrwrite)
            aCPU->sfrwrite(aCPU, address);
    }
    else
    {
        aCPU->mLowerData[address] = pop_from_stack(aCPU);
    }

    PC += 2;
    return 1;
}